

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall kratos::PortLegalityFixVisitor::visit(PortLegalityFixVisitor *this,Generator *gen)

{
  bool bVar1;
  PortDirection PVar2;
  int iVar3;
  StatementType SVar4;
  VarType VVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  element_type *peVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  element_type *peVar8;
  Generator *pGVar9;
  undefined4 extraout_var_01;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar10;
  undefined4 extraout_var_02;
  InternalException *this_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  element_type *this_02;
  element_type *this_03;
  Var **ppVVar11;
  element_type *peVar12;
  element_type *peVar13;
  undefined1 local_208 [8];
  shared_ptr<kratos::Expr> expr_2;
  Var *right;
  undefined1 local_1e0 [8];
  shared_ptr<kratos::Expr> expr_1;
  undefined1 local_1c0 [8];
  shared_ptr<kratos::SwitchStmt> case_;
  undefined1 local_1a0 [8];
  shared_ptr<kratos::Expr> expr;
  undefined1 local_180 [8];
  shared_ptr<kratos::IfStmt> if_;
  Stmt *parent_stmt;
  undefined1 local_152;
  allocator<char> local_151;
  string local_150;
  _Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> local_130;
  undefined1 local_128 [24];
  shared_ptr<kratos::Var> *src;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sources;
  shared_ptr<kratos::AssignStmt> *stmt;
  iterator __end3;
  iterator __begin3;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range3;
  _Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> local_e0;
  _Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> local_d8;
  undefined1 local_d0 [8];
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sinks;
  undefined1 local_88 [24];
  shared_ptr<kratos::Port> *port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  Generator *parent_gen;
  Generator *gen_local;
  PortLegalityFixVisitor *this_local;
  
  port_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)Generator::parent_generator(gen);
  psVar6 = Generator::get_port_names_abi_cxx11_(gen);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range2,psVar6);
  __end2 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
  port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
  do {
    bVar1 = std::operator!=(&__end2,(_Self *)&port_name);
    if (!bVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
      return;
    }
    port = (shared_ptr<kratos::Port> *)
           std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end2);
    Generator::get_port((Generator *)local_88,(string *)gen);
    local_88._16_8_ = local_88;
    peVar7 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88._16_8_);
    PVar2 = Port::port_direction(peVar7);
    if (PVar2 == In) {
      peVar7 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88._16_8_);
      iVar3 = (*(peVar7->super_Var).super_IRNode._vptr_IRNode[0xe])();
      local_d8._M_cur =
           (__node_type *)
           std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)CONCAT44(extraout_var,iVar3));
      peVar7 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88._16_8_);
      iVar3 = (*(peVar7->super_Var).super_IRNode._vptr_IRNode[0xe])();
      local_e0._M_cur =
           (__node_type *)
           std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                  *)CONCAT44(extraout_var_00,iVar3));
      std::allocator<std::shared_ptr<kratos::AssignStmt>_>::allocator
                ((allocator<std::shared_ptr<kratos::AssignStmt>_> *)((long)&__range3 + 5));
      std::
      unordered_set<std::shared_ptr<kratos::AssignStmt>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
      ::
      unordered_set<std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,true,false>>
                ((unordered_set<std::shared_ptr<kratos::AssignStmt>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                  *)local_d0,
                 (_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>)
                 local_d8._M_cur,
                 (_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>)
                 local_e0._M_cur,0,(hasher *)((long)&__range3 + 7),
                 (key_equal *)((long)&__range3 + 6),
                 (allocator<std::shared_ptr<kratos::AssignStmt>_> *)((long)&__range3 + 5));
      std::allocator<std::shared_ptr<kratos::AssignStmt>_>::~allocator
                ((allocator<std::shared_ptr<kratos::AssignStmt>_> *)((long)&__range3 + 5));
      __end3 = std::
               unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                        *)local_d0);
      stmt = (shared_ptr<kratos::AssignStmt> *)
             std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)local_d0);
      while (bVar1 = std::__detail::operator!=
                               (&__end3.
                                 super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                                ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)
                                 &stmt), bVar1) {
        sources = (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   *)std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
                     ::operator*(&__end3);
        peVar8 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)sources);
        pGVar9 = Stmt::generator_parent(&peVar8->super_Stmt);
        if (pGVar9 == (Generator *)port_names._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          peVar7 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_88._16_8_);
          iVar3 = (*(peVar7->super_Var).super_IRNode._vptr_IRNode[0x10])();
          src = (shared_ptr<kratos::Var> *)CONCAT44(extraout_var_01,iVar3);
          bVar1 = std::
                  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                  ::empty((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                           *)src);
          if (!bVar1) {
            local_130._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                 ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                          *)src);
            this_00 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::__detail::
                         _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
                         operator*((_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
                                    *)&local_130);
            peVar8 = std::
                     __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(this_00);
            AssignStmt::right(peVar8);
            std::enable_shared_from_this<kratos::Var>::shared_from_this
                      ((enable_shared_from_this<kratos::Var> *)local_128);
            local_128._16_8_ = local_128;
            peVar10 = std::
                      __shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_128._16_8_);
            iVar3 = (*(peVar10->super_IRNode)._vptr_IRNode[0xd])();
            if (CONCAT44(extraout_var_02,iVar3) !=
                port_names._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              local_152 = '\x01';
              this_01 = (InternalException *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_150,"Invalid src generator",&local_151);
              InternalException::InternalException(this_01,&local_150);
              local_152 = '\0';
              __cxa_throw(this_01,&InternalException::typeinfo,InternalException::~InternalException
                         );
            }
            peVar7 = std::
                     __shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_88._16_8_);
            iVar3 = (*(peVar7->super_Var).super_IRNode._vptr_IRNode[0xd])();
            peVar8 = std::
                     __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)sources);
            AssignStmt::left(peVar8);
            std::enable_shared_from_this<kratos::Var>::shared_from_this
                      ((enable_shared_from_this<kratos::Var> *)&parent_stmt);
            bVar1 = Generator::is_auxiliary_var
                              ((Generator *)CONCAT44(extraout_var_03,iVar3),
                               (shared_ptr<kratos::Var> *)&parent_stmt);
            std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&parent_stmt);
            if (bVar1) {
              peVar8 = std::
                       __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)sources);
              iVar3 = (*(peVar8->super_Stmt).super_IRNode._vptr_IRNode[4])();
              if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var_04,iVar3);
              SVar4 = Stmt::type((Stmt *)if_.
                                         super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
              if (SVar4 == If) {
                Stmt::as<kratos::IfStmt>((Stmt *)local_180);
                std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_180);
                IfStmt::predicate((IfStmt *)
                                  &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
                peVar10 = std::
                          __shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&expr.
                                           super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
                VVar5 = Var::type(peVar10);
                std::shared_ptr<kratos::Var>::~shared_ptr
                          ((shared_ptr<kratos::Var> *)
                           &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                if (VVar5 == Expression) {
                  std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_180);
                  IfStmt::predicate((IfStmt *)
                                    &case_.
                                     super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
                  std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&case_.
                                 super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
                  Var::as<kratos::Expr>((Var *)local_1a0);
                  std::shared_ptr<kratos::Var>::~shared_ptr
                            ((shared_ptr<kratos::Var> *)
                             &case_.
                              super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  peVar12 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                      ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                                       local_88._16_8_);
                  peVar13 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                                      ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                                       local_128._16_8_);
                  change_var_expr((shared_ptr<kratos::Expr> *)local_1a0,&peVar12->super_Var,peVar13,
                                  false);
                  std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_1a0);
                }
                else {
                  this_02 = std::
                            __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)local_180);
                  IfStmt::set_predicate(this_02,(shared_ptr<kratos::Var> *)local_128._16_8_);
                }
                std::shared_ptr<kratos::IfStmt>::~shared_ptr
                          ((shared_ptr<kratos::IfStmt> *)local_180);
              }
              else {
                Stmt::as<kratos::SwitchStmt>((Stmt *)local_1c0);
                std::
                __shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1c0);
                SwitchStmt::target((SwitchStmt *)
                                   &expr_1.
                                    super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
                peVar10 = std::
                          __shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&expr_1.
                                           super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
                VVar5 = Var::type(peVar10);
                std::shared_ptr<kratos::Var>::~shared_ptr
                          ((shared_ptr<kratos::Var> *)
                           &expr_1.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                if (VVar5 == Expression) {
                  std::
                  __shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_1c0);
                  SwitchStmt::target((SwitchStmt *)&right);
                  std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&right);
                  Var::as<kratos::Expr>((Var *)local_1e0);
                  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&right);
                  peVar12 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                      ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                                       local_88._16_8_);
                  peVar13 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                                      ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                                       local_128._16_8_);
                  change_var_expr((shared_ptr<kratos::Expr> *)local_1e0,&peVar12->super_Var,peVar13,
                                  false);
                  std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_1e0);
                }
                else {
                  this_03 = std::
                            __shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)local_1c0);
                  SwitchStmt::set_target(this_03,(shared_ptr<kratos::Var> *)local_128._16_8_);
                }
                std::shared_ptr<kratos::SwitchStmt>::~shared_ptr
                          ((shared_ptr<kratos::SwitchStmt> *)local_1c0);
              }
            }
            else {
              peVar8 = std::
                       __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)sources);
              ppVVar11 = AssignStmt::right(peVar8);
              expr_2.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppVVar11;
              VVar5 = Var::type((Var *)expr_2.
                                       super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi);
              if (VVar5 == Expression) {
                Var::as<kratos::Expr>((Var *)local_208);
                peVar12 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                    ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                                     local_88._16_8_);
                peVar13 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                                    ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                                     local_128._16_8_);
                change_var_expr((shared_ptr<kratos::Expr> *)local_208,&peVar12->super_Var,peVar13,
                                false);
                std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_208);
              }
              else {
                peVar13 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                                    ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                                     local_128._16_8_);
                peVar8 = std::
                         __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)sources);
                ppVVar11 = AssignStmt::right(peVar8);
                *ppVVar11 = peVar13;
              }
            }
            std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_128);
          }
        }
        std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator++
                  (&__end3);
      }
      std::
      unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
      ::~unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                        *)local_d0);
      sinks._M_h._M_single_bucket._0_4_ = 0;
    }
    else {
      sinks._M_h._M_single_bucket._0_4_ = 3;
    }
    std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_88);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void visit(Generator* gen) override {
        auto const* parent_gen = gen->parent_generator();
        auto port_names = gen->get_port_names();
        for (auto const& port_name : port_names) {
            auto const& port = gen->get_port(port_name);
            if (port->port_direction() != PortDirection::In) continue;
            auto sinks = std::unordered_set(port->sinks().begin(), port->sinks().end());
            for (auto const& stmt : sinks) {
                if (stmt->generator_parent() != parent_gen) continue;
                // if we have any sinks that's in the parent scope, it's an illegal assignment
                // we have to figure out the source
                auto const& sources = port->sources();
                if (sources.empty()) continue;
                auto const& src = (*sources.begin())->right()->shared_from_this();
                if (src->generator() != parent_gen)
                    throw InternalException("Invalid src generator");
                // replace the source with this src
                // depends on the context, it could be an auxiliary stmt
                if (port->generator()->is_auxiliary_var(stmt->left()->shared_from_this())) {
                    auto* parent_stmt = reinterpret_cast<Stmt*>(stmt->parent());
                    if (parent_stmt->type() == StatementType::If) {
                        auto if_ = parent_stmt->as<IfStmt>();
                        if (if_->predicate()->type() == VarType::Expression) {
                            auto expr = if_->predicate()->as<Expr>();
                            change_var_expr(expr, port.get(), src.get(), false);
                        } else {
                            if_->set_predicate(src);
                        }
                    } else {
                        // case statement
                        auto case_ = parent_stmt->as<SwitchStmt>();
                        if (case_->target()->type() == VarType::Expression) {
                            auto expr = case_->target()->as<Expr>();
                            change_var_expr(expr, port.get(), src.get(), false);
                        } else {
                            case_->set_target(src);
                        }
                    }
                } else {
                    auto* right = stmt->right();
                    if (right->type() == VarType::Expression) {
                        auto expr = right->as<Expr>();
                        change_var_expr(expr, port.get(), src.get(), false);
                    } else {
                        stmt->right() = src.get();
                    }
                }
            }
        }
    }